

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mixed_arena.h
# Opt level: O2

void __thiscall
ArenaVectorBase<ArenaVector<wasm::Expression*>,wasm::Expression*>::
set<std::initializer_list<wasm::Expression*>>
          (ArenaVectorBase<ArenaVector<wasm::Expression*>,wasm::Expression*> *this,
          initializer_list<wasm::Expression_*> *list)

{
  ulong size;
  iterator ppEVar1;
  ulong uVar2;
  long lVar3;
  
  size = list->_M_len;
  uVar2 = size;
  if (*(ulong *)(this + 0x10) < size) {
    ArenaVector<wasm::Expression_*>::allocate((ArenaVector<wasm::Expression_*> *)this,size);
    uVar2 = list->_M_len;
  }
  ppEVar1 = list->_M_array;
  for (lVar3 = 0; uVar2 * 8 != lVar3; lVar3 = lVar3 + 8) {
    *(undefined8 *)(*(long *)this + lVar3) = *(undefined8 *)((long)ppEVar1 + lVar3);
  }
  *(ulong *)(this + 8) = size;
  return;
}

Assistant:

void set(const ListType& list) {
    size_t size = list.size();
    if (allocatedElements < size) {
      static_cast<SubType*>(this)->allocate(size);
    }
    size_t i = 0;
    for (auto elem : list) {
      data[i++] = elem;
    }
    usedElements = size;
  }